

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,true>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<signed_char,_(unsigned_char)__x10_> SVar2;
  Simd<short,_(unsigned_char)__b_> result;
  Simd<signed_char,_(unsigned_char)__x10_> val;
  Simd<short,_(unsigned_char)__b_> local_28;
  char local_18 [16];
  
  SVar2 = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  local_18[0] = SVar2.v[0];
  local_18[1] = SVar2.v[1];
  local_18[2] = SVar2.v[2];
  local_18[3] = SVar2.v[3];
  local_18[4] = SVar2.v[4];
  local_18[5] = SVar2.v[5];
  local_18[6] = SVar2.v[6];
  local_18[7] = SVar2.v[7];
  local_18[8] = SVar2.v[8];
  local_18[9] = SVar2.v[9];
  local_18[10] = SVar2.v[10];
  local_18[0xb] = SVar2.v[0xb];
  local_18[0xc] = SVar2.v[0xc];
  local_18[0xd] = SVar2.v[0xd];
  local_18[0xe] = SVar2.v[0xe];
  local_18[0xf] = SVar2.v[0xf];
  lVar1 = 0;
  do {
    local_28.v[lVar1] = (short)local_18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  Push<wabt::interp::Simd<short,(unsigned_char)8>>(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}